

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeReadBitTest::CompareWithReference
          (MapRangeReadBitTest *this,GLuint *data,GLintptr offset,GLsizei length)

{
  long lVar1;
  GLuint *pGVar2;
  ostringstream *poVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_198 [384];
  
  if (data == (GLuint *)0x0) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"glMapNamedBufferRange called with offset ");
    std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<((ostream *)poVar3," and length ");
    std::ostream::operator<<(poVar3,length);
    std::operator<<((ostream *)poVar3," returned NULL pointer, but buffer\'s data was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
LAB_00af4357:
    bVar4 = true;
  }
  else {
    uVar5 = (ulong)offset >> 2 & 0xffffffff;
    lVar6 = 0;
    do {
      if (((ulong)(length + offset) >> 2 & 0xffffffff) <= uVar5 + lVar6) goto LAB_00af4357;
      pGVar2 = data + lVar6;
      lVar1 = lVar6 * 4;
      lVar6 = lVar6 + 1;
    } while (*pGVar2 == *(GLuint *)(s_reference + uVar5 * 4 + lVar1));
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar3 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"glMapNamedBufferRange called with offset ");
    std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<((ostream *)poVar3," and length ");
    std::ostream::operator<<(poVar3,length);
    std::operator<<((ostream *)poVar3,
                    " returned pointer to data which is not identical to reference data.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MapRangeReadBitTest::CompareWithReference(glw::GLuint* data, glw::GLintptr offset, glw::GLsizei length)
{
	if (DE_NULL == data)
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
			<< length << " returned NULL pointer, but buffer's data was expected." << tcu::TestLog::EndMessage;
	}
	else
	{
		glw::GLuint start = static_cast<glw::GLuint>((offset) / sizeof(s_reference[0]));
		glw::GLuint end   = static_cast<glw::GLuint>((offset + length) / sizeof(s_reference[0]));

		/* Comparison results with reference data. */
		for (glw::GLuint i = start; i < end; ++i)
		{
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
			if (data[i - start] != s_reference[i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
					<< length << " returned pointer to data which is not identical to reference data."
					<< tcu::TestLog::EndMessage;

				return false;
			}
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic pop
#endif
		}
	}

	return true;
}